

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall
QListWidgetItem::QListWidgetItem(QListWidgetItem *this,QString *text,QListWidget *listview,int type)

{
  QFlagsStorageHelper<Qt::ItemFlag,_4> QVar1;
  QListWidgetItem *item;
  QListModel *pQVar2;
  undefined4 in_ECX;
  long in_RDX;
  QString *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QListModel *model;
  QSignalBlocker bm;
  QSignalBlocker b;
  undefined4 in_stack_ffffffffffffff48;
  ItemFlag in_stack_ffffffffffffff4c;
  QListWidgetItem *in_stack_ffffffffffffff50;
  QObject *in_stack_ffffffffffffff58;
  int row;
  QListModel *this_00;
  undefined1 local_68 [24];
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_50;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_4c;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = (long)&PTR__QListWidgetItem_00d2f268;
  *(undefined4 *)(in_RDI + 1) = in_ECX;
  in_RDI[2] = in_RDX;
  item = (QListWidgetItem *)operator_new(0x28);
  QListWidgetItemPrivate::QListWidgetItemPrivate
            ((QListWidgetItemPrivate *)in_stack_ffffffffffffff50,
             (QListWidgetItem *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  in_RDI[3] = (long)item;
  local_50.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                     (enum_type)in_stack_ffffffffffffff50);
  local_4c.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator|
                 ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  QVar1.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator|
                 ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  ((QFlagsStorageHelper<Qt::ItemFlag,_4> *)(in_RDI + 4))->super_QFlagsStorage<Qt::ItemFlag> =
       QVar1.super_QFlagsStorage<Qt::ItemFlag>.i;
  pQVar2 = listModel(in_stack_ffffffffffffff50);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QSignalBlocker::QSignalBlocker((QSignalBlocker *)item,in_stack_ffffffffffffff58);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QSignalBlocker::QSignalBlocker((QSignalBlocker *)item,in_stack_ffffffffffffff58);
  ::QVariant::QVariant(&local_28,in_RSI);
  (**(code **)(*in_RDI + 0x20))(in_RDI,0,&local_28);
  row = (int)((ulong)in_RDI >> 0x20);
  ::QVariant::~QVariant(&local_28);
  QSignalBlocker::~QSignalBlocker((QSignalBlocker *)in_stack_ffffffffffffff50);
  QSignalBlocker::~QSignalBlocker((QSignalBlocker *)in_stack_ffffffffffffff50);
  if (pQVar2 != (QListModel *)0x0) {
    this_00 = pQVar2;
    QModelIndex::QModelIndex((QModelIndex *)0x89bd27);
    (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,local_68);
    QListModel::insert(this_00,row,item);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem::QListWidgetItem(const QString &text, QListWidget *listview, int type)
    : rtti(type), view(listview), d(new QListWidgetItemPrivate(this)),
      itemFlags(Qt::ItemIsSelectable
                |Qt::ItemIsUserCheckable
                |Qt::ItemIsEnabled
                |Qt::ItemIsDragEnabled)
{
    QListModel *model = listModel();
    {
        QSignalBlocker b(view);
        QSignalBlocker bm(model);
        setData(Qt::DisplayRole, text);
    }
    if (model)
        model->insert(model->rowCount(), this);
}